

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O3

Value ** __thiscall
ValueHashTable<ExprHash,_Value_*>::Get(ValueHashTable<ExprHash,_Value_*> *this,uint key)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  undefined1 local_40 [8];
  Iterator __iter;
  
  pSVar5 = this->table + (ulong)key % (ulong)this->tableSize;
  local_40 = (undefined1  [8])pSVar5;
  __iter.list = pSVar5;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    if (pSVar5 == (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pSVar5 = __iter.list;
    }
    __iter.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                  (pSVar5->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_40) goto LAB_00498b35;
    pTVar4 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    pSVar5 = __iter.list;
  } while (key < (uint)pTVar4->value);
  if (pTVar4->value != (ExprHash)key) {
LAB_00498b35:
    pTVar4 = (Type *)0x0;
  }
  return &pTVar4->element;
}

Assistant:

TElement * Get(uint key)
    {
        uint hash = this->Hash(key);
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY(HashBucket, bucket, &this->table[hash])
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    return &(bucket.element);
                }
                break;
            }
        } NEXT_SLISTBASE_ENTRY;

        return NULL;
    }